

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_fnmatch.c
# Opt level: O0

int parsekeyword(uchar **pattern,uchar *charset)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  byte *pbStack_40;
  char c;
  uchar *p;
  int i;
  int found;
  char keyword [10];
  parsekey_state state;
  uchar *charset_local;
  uchar **pattern_local;
  
  keyword[2] = '\0';
  keyword[3] = '\0';
  keyword[4] = '\0';
  keyword[5] = '\0';
  unique0x1000027c = charset;
  memset((void *)((long)&i + 2),0,10);
  bVar2 = false;
  p._0_4_ = 0;
  pbStack_40 = *pattern;
  while (!bVar2) {
    bVar1 = *pbStack_40;
    if (9 < (int)p) {
      return 0;
    }
    if (keyword._2_4_ == 0) {
      iVar3 = Curl_islower((uint)bVar1);
      if (iVar3 == 0) {
        if (bVar1 != 0x3a) {
          return 0;
        }
        keyword[2] = '\x01';
        keyword[3] = '\0';
        keyword[4] = '\0';
        keyword[5] = '\0';
      }
      else {
        *(byte *)((long)&i + (long)(int)p + 2) = bVar1;
      }
    }
    else if (keyword._2_4_ == 1) {
      if (bVar1 != 0x5d) {
        return 0;
      }
      bVar2 = true;
    }
    p._0_4_ = (int)p + 1;
    pbStack_40 = pbStack_40 + 1;
  }
  *pattern = pbStack_40;
  iVar3 = strcmp((char *)((long)&i + 2),"digit");
  if (iVar3 == 0) {
    stack0xffffffffffffffe0[0x102] = '\x01';
  }
  else {
    iVar3 = strcmp((char *)((long)&i + 2),"alnum");
    if (iVar3 == 0) {
      stack0xffffffffffffffe0[0x101] = '\x01';
    }
    else {
      iVar3 = strcmp((char *)((long)&i + 2),"alpha");
      if (iVar3 == 0) {
        stack0xffffffffffffffe0[0x104] = '\x01';
      }
      else {
        iVar3 = strcmp((char *)((long)&i + 2),"xdigit");
        if (iVar3 == 0) {
          stack0xffffffffffffffe0[0x103] = '\x01';
        }
        else {
          iVar3 = strcmp((char *)((long)&i + 2),"print");
          if (iVar3 == 0) {
            stack0xffffffffffffffe0[0x105] = '\x01';
          }
          else {
            iVar3 = strcmp((char *)((long)&i + 2),"graph");
            if (iVar3 == 0) {
              stack0xffffffffffffffe0[0x108] = '\x01';
            }
            else {
              iVar3 = strcmp((char *)((long)&i + 2),"space");
              if (iVar3 == 0) {
                stack0xffffffffffffffe0[0x109] = '\x01';
              }
              else {
                iVar3 = strcmp((char *)((long)&i + 2),"blank");
                if (iVar3 == 0) {
                  stack0xffffffffffffffe0[0x106] = '\x01';
                }
                else {
                  iVar3 = strcmp((char *)((long)&i + 2),"upper");
                  if (iVar3 == 0) {
                    stack0xffffffffffffffe0[0x10a] = '\x01';
                  }
                  else {
                    iVar3 = strcmp((char *)((long)&i + 2),"lower");
                    if (iVar3 != 0) {
                      return 0;
                    }
                    stack0xffffffffffffffe0[0x107] = '\x01';
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

static int parsekeyword(unsigned char **pattern, unsigned char *charset)
{
  parsekey_state state = CURLFNM_PKW_INIT;
#define KEYLEN 10
  char keyword[KEYLEN] = { 0 };
  int found = FALSE;
  int i;
  unsigned char *p = *pattern;
  for(i = 0; !found; i++) {
    char c = *p++;
    if(i >= KEYLEN)
      return SETCHARSET_FAIL;
    switch(state) {
    case CURLFNM_PKW_INIT:
      if(ISLOWER(c))
        keyword[i] = c;
      else if(c == ':')
        state = CURLFNM_PKW_DDOT;
      else
        return SETCHARSET_FAIL;
      break;
    case CURLFNM_PKW_DDOT:
      if(c == ']')
        found = TRUE;
      else
        return SETCHARSET_FAIL;
    }
  }
#undef KEYLEN

  *pattern = p; /* move caller's pattern pointer */
  if(strcmp(keyword, "digit") == 0)
    charset[CURLFNM_DIGIT] = 1;
  else if(strcmp(keyword, "alnum") == 0)
    charset[CURLFNM_ALNUM] = 1;
  else if(strcmp(keyword, "alpha") == 0)
    charset[CURLFNM_ALPHA] = 1;
  else if(strcmp(keyword, "xdigit") == 0)
    charset[CURLFNM_XDIGIT] = 1;
  else if(strcmp(keyword, "print") == 0)
    charset[CURLFNM_PRINT] = 1;
  else if(strcmp(keyword, "graph") == 0)
    charset[CURLFNM_GRAPH] = 1;
  else if(strcmp(keyword, "space") == 0)
    charset[CURLFNM_SPACE] = 1;
  else if(strcmp(keyword, "blank") == 0)
    charset[CURLFNM_BLANK] = 1;
  else if(strcmp(keyword, "upper") == 0)
    charset[CURLFNM_UPPER] = 1;
  else if(strcmp(keyword, "lower") == 0)
    charset[CURLFNM_LOWER] = 1;
  else
    return SETCHARSET_FAIL;
  return SETCHARSET_OK;
}